

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCore.c
# Opt level: O1

int Sbd_ManFindCands(Sbd_Man_t *p,word *Cover,int nDivs)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  Vec_Int_t *pVVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  undefined1 *puVar19;
  ulong uVar20;
  undefined1 *puVar21;
  undefined1 *puVar22;
  ulong uVar23;
  int iVar24;
  ulong uVar25;
  ulong uVar26;
  int Order [64];
  int Ones [64];
  int local_238 [3];
  undefined1 local_22c [244];
  uint local_138 [66];
  
  iVar7 = nDivs + 3;
  if (-1 < nDivs) {
    iVar7 = nDivs;
  }
  uVar2 = Cover[nDivs];
  uVar26 = (ulong)(uint)nDivs;
  if ((7 < nDivs) && (p->pPars->fCover == 0)) {
    pVVar13 = p->vDivSet;
    pVVar13->nSize = 0;
    uVar10 = 0;
    while (Cover[uVar10] != uVar2) {
      uVar10 = uVar10 + 1;
      if (uVar26 == uVar10) {
        uVar10 = 1;
        if (1 < nDivs) {
          uVar10 = (ulong)(uint)nDivs;
        }
        uVar8 = 1;
        uVar3 = 0;
        do {
          uVar23 = uVar3 + 1;
          if (uVar23 < uVar26) {
            uVar25 = uVar8;
            do {
              if ((Cover[uVar25] | Cover[uVar3]) == uVar2) {
                Vec_IntPush(pVVar13,(int)uVar3);
                pVVar13 = p->vDivSet;
LAB_0053a4ea:
                iVar7 = (int)uVar25;
                goto LAB_0053a4ed;
              }
              uVar25 = uVar25 + 1;
            } while (uVar26 != uVar25);
          }
          uVar8 = uVar8 + 1;
          uVar3 = uVar23;
          if (uVar23 == uVar10) {
            uVar3 = 0;
            do {
              uVar8 = Cover[uVar3] - (Cover[uVar3] >> 1 & 0x5555555555555555);
              uVar8 = (uVar8 >> 2 & 0x3333333333333333) + (uVar8 & 0x3333333333333333);
              uVar8 = (uVar8 >> 4) + uVar8 & 0xf0f0f0f0f0f0f0f;
              uVar8 = (uVar8 >> 8) + uVar8;
              lVar11 = (uVar8 >> 0x10) + uVar8;
              local_138[uVar3] = (int)((ulong)lVar11 >> 0x20) + (int)lVar11 & 0xff;
              uVar3 = uVar3 + 1;
            } while (uVar10 != uVar3);
            uVar3 = 0;
            do {
              local_238[uVar3] = (int)uVar3;
              uVar3 = uVar3 + 1;
            } while (uVar10 != uVar3);
            Vec_IntSelectSortCost2Reverse(local_238,nDivs,(int *)local_138);
            uVar3 = (ulong)(nDivs / 2 + 3);
            uVar8 = (ulong)(nDivs / 3 + 2);
            uVar20 = (ulong)((iVar7 >> 2) + 1);
            uVar14 = 2;
            uVar23 = 1;
            uVar10 = 0;
            do {
              uVar12 = uVar10 + 1;
              uVar16 = uVar14;
              uVar25 = uVar23;
              if (uVar12 < uVar8) {
                do {
                  uVar18 = uVar25 + 1;
                  if (uVar18 < uVar3) {
                    iVar7 = local_238[uVar25];
                    uVar25 = uVar16;
                    do {
                      lVar9 = (long)local_238[uVar25];
                      if ((Cover[lVar9] | Cover[iVar7] | Cover[local_238[uVar10]]) == uVar2) {
                        Vec_IntPush(pVVar13,local_238[uVar10]);
                        pVVar13 = p->vDivSet;
LAB_0053a54a:
                        Vec_IntPush(pVVar13,iVar7);
                        pVVar13 = p->vDivSet;
                        iVar7 = (int)lVar9;
                        goto LAB_0053a4ed;
                      }
                      uVar25 = uVar25 + 1;
                    } while (uVar25 < uVar3);
                  }
                  uVar16 = uVar16 + 1;
                  uVar25 = uVar18;
                } while (uVar18 != uVar8);
              }
              uVar14 = uVar14 + 1;
              uVar23 = uVar23 + 1;
              uVar10 = uVar12;
              if (uVar12 == uVar20) {
                lVar11 = 3;
                uVar23 = 2;
                uVar14 = 1;
                puVar22 = local_22c;
                uVar10 = 0;
                do {
                  uVar16 = uVar10 + 1;
                  uVar12 = uVar23;
                  uVar18 = uVar14;
                  lVar4 = lVar11;
                  puVar21 = puVar22;
                  if (uVar16 < uVar8) {
                    do {
                      uVar1 = uVar18 + 1;
                      uVar25 = uVar12;
                      lVar5 = lVar4;
                      puVar19 = puVar21;
                      uVar15 = uVar1;
                      while (uVar15 < uVar3) {
                        uVar15 = uVar25 + 1;
                        if (uVar15 < uVar26) {
                          iVar6 = local_238[uVar18];
                          iVar7 = local_238[uVar25];
                          lVar17 = 0;
                          do {
                            uVar25 = (ulong)*(int *)(puVar19 + lVar17 * 4);
                            if ((Cover[uVar25] |
                                Cover[iVar6] | Cover[local_238[uVar10]] | Cover[iVar7]) == uVar2) {
                              Vec_IntPush(pVVar13,local_238[uVar10]);
                              Vec_IntPush(p->vDivSet,iVar6);
                              pVVar13 = p->vDivSet;
                              goto LAB_0053a51d;
                            }
                            lVar9 = lVar5 + lVar17;
                            lVar17 = lVar17 + 1;
                          } while (lVar9 + 1U < uVar26);
                        }
                        lVar5 = lVar5 + 1;
                        puVar19 = puVar19 + 4;
                        uVar25 = uVar15;
                      }
                      lVar4 = lVar4 + 1;
                      uVar12 = uVar12 + 1;
                      puVar21 = puVar21 + 4;
                      uVar18 = uVar1;
                    } while (uVar1 != uVar8);
                  }
                  lVar11 = lVar11 + 1;
                  uVar23 = uVar23 + 1;
                  uVar14 = uVar14 + 1;
                  puVar22 = puVar22 + 4;
                  uVar10 = uVar16;
                  if (uVar16 == uVar20) {
                    return 0;
                  }
                } while( true );
              }
            } while( true );
          }
        } while( true );
      }
    }
LAB_0053a4c6:
    iVar7 = (int)uVar10;
LAB_0053a4ed:
    Vec_IntPush(pVVar13,iVar7);
    return 1;
  }
  pVVar13 = p->vDivSet;
  pVVar13->nSize = 0;
  if (0 < nDivs) {
    uVar10 = 0;
    do {
      if (Cover[uVar10] == uVar2) goto LAB_0053a4c6;
      uVar10 = uVar10 + 1;
    } while (uVar26 != uVar10);
    if (0 < nDivs) {
      uVar3 = 1;
      uVar10 = 0;
      do {
        uVar8 = uVar10 + 1;
        if (uVar8 < uVar26) {
          uVar23 = uVar3;
          do {
            if ((Cover[uVar23] | Cover[uVar10]) == uVar2) {
              Vec_IntPush(pVVar13,(int)uVar10);
              pVVar13 = p->vDivSet;
              iVar7 = (int)uVar23;
              goto LAB_0053a4ed;
            }
            uVar23 = uVar23 + 1;
          } while (uVar26 != uVar23);
        }
        uVar3 = uVar3 + 1;
        uVar10 = uVar8;
      } while (uVar8 != uVar26);
      if (0 < nDivs) {
        uVar3 = 2;
        uVar8 = 1;
        uVar10 = 0;
        do {
          uVar14 = uVar10 + 1;
          uVar23 = uVar3;
          uVar20 = uVar8;
          if (uVar14 < uVar26) {
            do {
              uVar16 = uVar20 + 1;
              if ((int)uVar16 < nDivs) {
                uVar25 = uVar23;
LAB_0053a0e9:
                if ((Cover[uVar25] | Cover[uVar20] | Cover[uVar10]) != uVar2) goto code_r0x0053a0f9;
                Vec_IntPush(pVVar13,(int)uVar10);
                pVVar13 = p->vDivSet;
                iVar7 = (int)uVar20;
LAB_0053a51d:
                Vec_IntPush(pVVar13,iVar7);
                pVVar13 = p->vDivSet;
                goto LAB_0053a4ea;
              }
LAB_0053a101:
              uVar23 = uVar23 + 1;
              uVar20 = uVar16;
            } while (uVar16 != uVar26);
          }
          uVar3 = uVar3 + 1;
          uVar8 = uVar8 + 1;
          uVar10 = uVar14;
        } while (uVar14 != uVar26);
        if (0 < nDivs) {
          iVar7 = 3;
          lVar11 = 2;
          uVar3 = 1;
          uVar10 = 0;
          do {
            uVar23 = uVar10 + 1;
            lVar4 = lVar11;
            uVar8 = uVar3;
            iVar6 = iVar7;
            if (uVar23 < uVar26) {
              do {
                uVar20 = uVar8 + 1;
                if ((int)uVar20 < nDivs) {
                  lVar17 = (long)iVar6;
                  lVar5 = lVar4;
                  do {
                    iVar24 = (int)(lVar5 + 1);
                    if (iVar24 < nDivs) {
                      lVar9 = lVar17;
                      do {
                        if ((Cover[lVar9] | Cover[uVar8] | Cover[uVar10] | Cover[lVar5]) == uVar2) {
                          Vec_IntPush(pVVar13,(int)uVar10);
                          Vec_IntPush(p->vDivSet,(int)uVar8);
                          pVVar13 = p->vDivSet;
                          iVar7 = (int)lVar5;
                          goto LAB_0053a54a;
                        }
                        lVar9 = lVar9 + 1;
                      } while (lVar9 < (long)uVar26);
                    }
                    lVar17 = lVar17 + 1;
                    lVar5 = lVar5 + 1;
                  } while (iVar24 < nDivs);
                }
                iVar6 = iVar6 + 1;
                lVar4 = lVar4 + 1;
                uVar8 = uVar20;
              } while (uVar20 != uVar26);
            }
            iVar7 = iVar7 + 1;
            lVar11 = lVar11 + 1;
            uVar3 = uVar3 + 1;
            uVar10 = uVar23;
            if (uVar23 == uVar26) {
              return 0;
            }
          } while( true );
        }
      }
    }
  }
  return 0;
code_r0x0053a0f9:
  uVar25 = uVar25 + 1;
  if (nDivs <= (int)uVar25) goto LAB_0053a101;
  goto LAB_0053a0e9;
}

Assistant:

static inline int Sbd_ManFindCands( Sbd_Man_t * p, word Cover[64], int nDivs )
{
    int Ones[64], Order[64];
    int Limits[4] = { nDivs/4+1, nDivs/3+2, nDivs/2+3, nDivs };
    int c0, c1, c2, c3;
    word Target = Cover[nDivs];

    if ( nDivs < 8 || p->pPars->fCover )
        return Sbd_ManFindCandsSimple( p, Cover, nDivs );

    Vec_IntClear( p->vDivSet );
    for ( c0 = 0; c0 < nDivs; c0++ )
        if ( Cover[c0] == Target )
        {
            Vec_IntPush( p->vDivSet, c0 );
            return 1;
        }

    for ( c0 = 0;    c0 < nDivs; c0++ )
    for ( c1 = c0+1; c1 < nDivs; c1++ )
        if ( (Cover[c0] | Cover[c1]) == Target )
        {
            Vec_IntPush( p->vDivSet, c0 );
            Vec_IntPush( p->vDivSet, c1 );
            return 1;
        }

    // count ones
    for ( c0 = 0; c0 < nDivs; c0++ )
        Ones[c0] = Abc_TtCountOnes( Cover[c0] );

    // sort by the number of ones
    for ( c0 = 0; c0 < nDivs; c0++ )
        Order[c0] = c0;
    Vec_IntSelectSortCost2Reverse( Order, nDivs, Ones );

    // sort with limits
    for ( c0 = 0;    c0 < Limits[0]; c0++ )
    for ( c1 = c0+1; c1 < Limits[1]; c1++ )
    for ( c2 = c1+1; c2 < Limits[2]; c2++ )
        if ( (Cover[Order[c0]] | Cover[Order[c1]] | Cover[Order[c2]]) == Target )
        {
            Vec_IntPush( p->vDivSet, Order[c0] );
            Vec_IntPush( p->vDivSet, Order[c1] );
            Vec_IntPush( p->vDivSet, Order[c2] );
            return 1;
        }

    for ( c0 = 0;    c0 < Limits[0]; c0++ )
    for ( c1 = c0+1; c1 < Limits[1]; c1++ )
    for ( c2 = c1+1; c2 < Limits[2]; c2++ )
    for ( c3 = c2+1; c3 < Limits[3]; c3++ )
    {
        if ( (Cover[Order[c0]] | Cover[Order[c1]] | Cover[Order[c2]] | Cover[Order[c3]]) == Target )
        {
            Vec_IntPush( p->vDivSet, Order[c0] );
            Vec_IntPush( p->vDivSet, Order[c1] );
            Vec_IntPush( p->vDivSet, Order[c2] );
            Vec_IntPush( p->vDivSet, Order[c3] );
            return 1;
        }
    }
    return 0;
}